

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes3TestPackage.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::TestCaseWrapper::iterate(TestCaseWrapper *this,TestCase *testCase)

{
  RenderContext *pRVar1;
  int iVar2;
  IterateResult IVar3;
  undefined4 extraout_var;
  
  pRVar1 = this->m_testPackage->m_context->m_renderCtx;
  iVar2 = (*pRVar1->_vptr_RenderContext[3])(pRVar1);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1c0))(0x3e000000,0x3e800000,0x3f000000,0x3f800000);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x188))(0x4000);
  IVar3 = (*(testCase->super_TestNode)._vptr_TestNode[4])(testCase);
  (*pRVar1->_vptr_RenderContext[5])(pRVar1);
  return IVar3;
}

Assistant:

tcu::TestNode::IterateResult TestCaseWrapper::iterate (tcu::TestCase* testCase)
{
	tcu::TestContext&				testCtx		= m_testPackage.getContext()->getTestContext();
	glu::RenderContext&				renderCtx	= m_testPackage.getContext()->getRenderContext();
	tcu::TestCase::IterateResult	result;

	// Clear to surrender-blue
	{
		const glw::Functions& gl = renderCtx.getFunctions();
		gl.clearColor(0.125f, 0.25f, 0.5f, 1.f);
		gl.clear(GL_COLOR_BUFFER_BIT);
	}

	result = testCase->iterate();

	// Call implementation specific post-iterate routine (usually handles native events and swaps buffers)
	try
	{
		renderCtx.postIterate();
		return result;
	}
	catch (const tcu::ResourceError& e)
	{
		testCtx.getLog() << e;
		testCtx.setTestResult(QP_TEST_RESULT_RESOURCE_ERROR, "Resource error in context post-iteration routine");
		testCtx.setTerminateAfter(true);
		return tcu::TestNode::STOP;
	}
	catch (const std::exception& e)
	{
		testCtx.getLog() << e;
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Error in context post-iteration routine");
		return tcu::TestNode::STOP;
	}
}